

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O2

ContextInitializer * __thiscall
Imf_3_4::ContextInitializer::setOutputStream(ContextInitializer *this,OStream *ostr)

{
  ostream_holder *this_00;
  
  this_00 = (ostream_holder *)operator_new(0x38);
  ostream_holder::ostream_holder(this_00,ostr);
  (this->_initializer).user_data = this_00;
  (this->_initializer).read_fn = (exr_read_func_ptr_t)0x0;
  (this->_initializer).size_fn = (exr_query_size_func_ptr_t)0x0;
  (this->_initializer).write_fn = ostream_write;
  (this->_initializer).destroy_fn = ostream_destroy;
  this->_ctxt_type = WRITE;
  return this;
}

Assistant:

ContextInitializer&
ContextInitializer::setOutputStream (OStream* ostr)
{
    _initializer.user_data  = new ostream_holder{ostr};
    _initializer.read_fn    = nullptr;
    _initializer.size_fn    = nullptr;
    _initializer.write_fn   = ostream_write;
    _initializer.destroy_fn = ostream_destroy;
    _ctxt_type              = ContextFileType::WRITE;
    return *this;
}